

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O2

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if ((action == 1) && ((key == 0x100 || (key == 0x51)))) {
    glfwSetWindowShouldClose(window,1);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_Q:
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
    }
}